

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  Timer TVar2;
  bool bVar3;
  bool bVar4;
  time_point this_00;
  OsStackTraceGetterInterface *pOVar5;
  TimeInMillis TVar6;
  TestInfo *pTVar7;
  int i;
  int i_00;
  duration local_48;
  Timer timer;
  
  if (this->should_run_ != true) {
    return;
  }
  this_00.__d.__r = (duration)internal::GetUnitTestImpl();
  *(TestSuite **)((long)this_00.__d.__r + 0x168) = this;
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
  timer.start_.__d.__r = (time_point)(time_point)this_00.__d.__r;
  pOVar5 = internal::UnitTestImpl::os_stack_trace_getter((UnitTestImpl *)this_00.__d.__r);
  (*pOVar5->_vptr_OsStackTraceGetterInterface[3])(pOVar5);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x1517f2,(char *)0x0);
  bVar3 = TestResult::Failed(&this->ad_hoc_test_result_);
  TVar6 = internal::GetTimeInMillis();
  this->start_timestamp_ = TVar6;
  local_48.__r = std::chrono::_V2::steady_clock::now();
  for (i = 1; i_00 = i + -1,
      i_00 < (int)((ulong)((long)(this->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i = i + 1) {
    pTVar7 = GetMutableTestInfo(this,i_00);
    if (bVar3) {
      TestInfo::Skip(pTVar7);
    }
    else {
      TestInfo::Run(pTVar7);
    }
    if (FLAGS_gtest_fail_fast == '\x01') {
      pTVar7 = GetMutableTestInfo(this,i_00);
      bVar4 = TestResult::Failed(&pTVar7->result_);
      if (bVar4) goto LAB_00140780;
    }
  }
LAB_00140791:
  TVar6 = internal::Timer::Elapsed((Timer *)&local_48);
  TVar2 = timer;
  this->elapsed_time_ = TVar6;
  pOVar5 = internal::UnitTestImpl::os_stack_trace_getter((UnitTestImpl *)timer.start_.__d.__r);
  (*pOVar5->_vptr_OsStackTraceGetterInterface[3])(pOVar5);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x151804,(char *)0x0);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar1,this);
  *(undefined8 *)((long)TVar2.start_.__d.__r + 0x168) = 0;
  return;
LAB_00140780:
  for (; i < (int)((ulong)((long)(this->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i = i + 1) {
    pTVar7 = GetMutableTestInfo(this,i);
    TestInfo::Skip(pTVar7);
  }
  goto LAB_00140791;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all = ad_hoc_test_result().Failed();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}